

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::push_arg<int,asmjit::X86Gp,asmjit::X86Gp>
               (X86Assembler *as,int arg1,X86Gp *args,X86Gp *args_1)

{
  undefined8 uVar1;
  anon_union_16_7_ed616b9d_for_Operand__0 local_100;
  undefined8 local_f0;
  undefined4 o0;
  undefined4 instId;
  X86Gp *args_local_1;
  X86Gp *args_local;
  int arg1_local;
  X86Assembler *as_local;
  
  local_f0 = (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  uVar1 = *(undefined8 *)
           ((long)&(args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0 + 8);
  instId = (undefined4)((ulong)uVar1 >> 0x20);
  o0 = (undefined4)uVar1;
  local_100._packed[0].field_10 =
       (args_1->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  local_100._mem.field_2 =
       (args_1->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2;
  push_arg<asmjit::X86Gp,asmjit::X86Gp>
            (as,(X86Gp *)&stack0xffffffffffffff10,(X86Gp *)&local_100._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)args_1,instId,o0);
  return;
}

Assistant:

static void push_arg(asmjit::X86Assembler& as, T1 arg1, Ts... args)
{
	push_arg(as, args...);
	as.push(arg1);
}